

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O1

VertexProperties * __thiscall
soinn::ESOINN::getBestMatch
          (VertexProperties *__return_storage_ptr__,ESOINN *this,
          vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *inputSignal)

{
  result_type rVar1;
  double dVar2;
  double dVar3;
  StoredVertex *sv;
  _List_node_base *p_Var4;
  StoredVertex *sv_1;
  _List_node_base *p_Var5;
  double local_48;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> *local_40
  ;
  _List_node_base *local_38;
  
  p_Var4 = (this->graph).super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  local_48 = 1.79769313486232e+308;
  p_Var5 = (_List_node_base *)0x0;
  do {
    local_38 = p_Var4[1]._M_next + 2;
    local_40 = inputSignal;
    rVar1 = boost::numeric::ublas::
            vector_norm_2<boost::numeric::ublas::vector_binary<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
            ::
            apply<boost::numeric::ublas::vector_binary<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
                      ((vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>
                        *)&local_40);
    if (rVar1 < local_48) {
      p_Var5 = p_Var4[1]._M_next;
      local_48 = rVar1;
    }
    p_Var4 = p_Var4->_M_next;
  } while (p_Var4 != (_List_node_base *)&(this->graph).super_type.m_vertices);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::unbounded_array
            ((unbounded_array<double,_std::allocator<double>_> *)__return_storage_ptr__,
             (unbounded_array<double,_std::allocator<double>_> *)(p_Var5 + 2));
  p_Var4 = *(_List_node_base **)((long)(p_Var5 + 3) + 8);
  dVar2 = (double)p_Var5[4]._M_next;
  dVar3 = (double)p_Var5[5]._M_next;
  *(_List_node_base **)&__return_storage_ptr__->numberOfSignals =
       *(_List_node_base **)((long)(p_Var5 + 4) + 8);
  __return_storage_ptr__->S = dVar3;
  *(_List_node_base **)&__return_storage_ptr__->classId = p_Var4;
  __return_storage_ptr__->density = dVar2;
  return __return_storage_ptr__;
}

Assistant:

VertexProperties ESOINN::getBestMatch(boost::numeric::ublas::vector<double>& inputSignal)
{
    Vertex firstWinner = NULL;
    double firstWinnerDistance = std::numeric_limits<double>::max();
    VertexIterator current, end;
    boost::tie(current, end) = boost::vertices(graph);
    for(; current != end; current++)
    {
        double dist = distance(inputSignal, graph[*current].weight);
        if(dist < firstWinnerDistance)
        {
            firstWinner = *current;
            firstWinnerDistance = dist;
        }
    }
    return graph[firstWinner];
}